

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall slang::IntervalMapDetails::Path::Path(Path *this)

{
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
            ((SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *)0x530b0e);
  return;
}

Assistant:

struct SLANG_EXPORT Path {
    Path() = default;

    bool valid() const { return !path.empty() && path.front().offset < path.front().size; }

    template<typename T>
    T& node(uint32_t level) const {
#ifdef SLANG_DEBUG
        SLANG_ASSERT(path[level].isLeaf == T::IsLeaf);
        SLANG_ASSERT(T::IsRoot == (level == 0));
#endif
        return *reinterpret_cast<T*>(path[level].node);
    }

    template<typename T>
    T& leaf() const {
#ifdef SLANG_DEBUG
        SLANG_ASSERT(path.back().isLeaf);
        SLANG_ASSERT(T::IsRoot == (path.size() == 1));
#endif
        return *reinterpret_cast<T*>(path.back().node);
    }

    uint32_t leafSize() const { return path.back().size; }
    uint32_t leafOffset() const { return path.back().offset; }
    uint32_t& leafOffset() { return path.back().offset; }

    uint32_t size(uint32_t level) const { return path[level].size; }
    uint32_t offset(uint32_t level) const { return path[level].offset; }
    uint32_t& offset(uint32_t level) { return path[level].offset; }

    uint32_t height() const {
        SLANG_ASSERT(!path.empty());
        return uint32_t(path.size() - 1);
    }

    // Gets the subtree referenced at the given level.
    NodeRef& childAt(uint32_t level) const { return path[level].childAt(path[level].offset); }

    // Clear the path and set a new root node.
    template<typename TNode>
    void setRoot(TNode* node, uint32_t size, uint32_t offset) {
        path.clear();
        path.emplace_back(node, size, offset);
    }

    // Update the size of the node at the given level.
    void setSize(uint32_t level, uint32_t size) {
        path[level].size = size;
        if (level)
            childAt(level - 1).setSize(size);
    }

    // Grow path to target height by taking leftmost branches.
    void fillLeft(uint32_t targetHeight) {
        while (height() < targetHeight)
            push(childAt(height()), 0);
    }

    // Replace the current root of the path without changing the rest of it.
    template<typename TNode>
    void replaceRoot(TNode* node, uint32_t size, IndexPair offset) {
        SLANG_ASSERT(!path.empty());
        path.front() = Entry(node, size, offset.first);
        path.insert(path.begin() + 1, Entry(childAt(0), offset.second));
    }

    void moveLeft(uint32_t level);
    void moveRight(uint32_t level);

    NodeRef getLeftSibling(uint32_t level) const;
    NodeRef getRightSibling(uint32_t level) const;

    void push(NodeRef node, uint32_t offset) { path.emplace_back(node, offset); }
    void pop() { path.pop_back(); }

    // Resets the cached information about the node at the given level after it's
    // been modified by some other operation.
    void reset(uint32_t level) { path[level] = Entry(childAt(level - 1), offset(level)); }

    // Makes sure the current path is prepared for insertion at the given level.
    // This is always true except when path is at the end (i.e. not valid()) and
    // we fix that by moving back to the last node in the level.
    void legalizeForInsert(uint32_t level) {
        if (valid())
            return;

        moveLeft(level);
        ++path[level].offset;
    }

    bool operator==(const Path& rhs) const {
        if (!valid())
            return !rhs.valid();

        if (leafOffset() != rhs.leafOffset())
            return false;

        return path.back().node == rhs.path.back().node;
    }

private:
    struct Entry {
        void* node;
        uint32_t size;
        uint32_t offset;
#ifdef SLANG_DEBUG
        bool isLeaf = false;
#endif

        Entry(std::nullptr_t, uint32_t size, uint32_t offset) :
            node(nullptr), size(size), offset(offset) {}

        template<typename TNode>
        Entry(TNode* node, uint32_t size, uint32_t offset) :
            node(node), size(size), offset(offset) {
#ifdef SLANG_DEBUG
            isLeaf = TNode::IsLeaf;
#endif
        }

        Entry(NodeRef node, uint32_t offset) :
            node(node.getPointer()), size(node.size()), offset(offset) {
#ifdef SLANG_DEBUG
            isLeaf = node.isLeaf;
#endif
        }

        NodeRef& childAt(uint32_t i) const {
#ifdef SLANG_DEBUG
            SLANG_ASSERT(!isLeaf);
#endif
            return reinterpret_cast<NodeRef*>(node)[i];
        }
    };
    SmallVector<Entry> path;
}